

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void ns_sock_to_str(sock_t sock,char *buf,size_t len,int flags)

{
  size_t sVar1;
  size_t sVar2;
  uint16_t uVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  socklen_t local_38;
  undefined1 local_34 [4];
  socklen_t slen;
  socket_address sa;
  int flags_local;
  size_t len_local;
  char *buf_local;
  sock_t sock_local;
  
  local_38 = 0x10;
  if ((buf != (char *)0x0) && (len != 0)) {
    *buf = '\0';
    sa._8_4_ = flags;
    unique0x10000129 = len;
    len_local = (size_t)buf;
    buf_local._4_4_ = sock;
    memset(local_34,0,0x10);
    if ((sa._8_4_ & 4) == 0) {
      getsockname(buf_local._4_4_,(sockaddr *)local_34,&local_38);
    }
    else {
      getpeername(buf_local._4_4_,(sockaddr *)local_34,&local_38);
    }
    if ((sa._8_4_ & 1) != 0) {
      inet_ntop((uint)(ushort)local_34._0_2_,&slen,(char *)len_local,
                (socklen_t)stack0xffffffffffffffe0);
    }
    sVar2 = len_local;
    if ((sa._8_4_ & 2) != 0) {
      sVar4 = strlen((char *)len_local);
      sVar1 = stack0xffffffffffffffe0;
      sVar5 = strlen((char *)len_local);
      pcVar6 = "";
      if ((sa._8_4_ & 1) != 0) {
        pcVar6 = ":";
      }
      uVar3 = ntohs(local_34._2_2_);
      snprintf((char *)(sVar2 + sVar4),sVar1 - (sVar5 + 1),"%s%d",pcVar6,(ulong)uVar3);
    }
  }
  return;
}

Assistant:

void ns_sock_to_str(sock_t sock, char *buf, size_t len, int flags) {
  union socket_address sa;
  socklen_t slen = sizeof(sa);

  if (buf != NULL && len > 0) {
    buf[0] = '\0';
    memset(&sa, 0, sizeof(sa));
    if (flags & 4) {
      getpeername(sock, &sa.sa, &slen);
    } else {
      getsockname(sock, &sa.sa, &slen);
    }
    if (flags & 1) {
#if defined(NS_ENABLE_IPV6)
      inet_ntop(sa.sa.sa_family, sa.sa.sa_family == AF_INET ?
                (void *) &sa.sin.sin_addr :
                (void *) &sa.sin6.sin6_addr, buf, len);
#elif defined(_WIN32)
      // Only Windoze Vista (and newer) have inet_ntop()
      strncpy(buf, inet_ntoa(sa.sin.sin_addr), len);
#else
      inet_ntop(sa.sa.sa_family, (void *) &sa.sin.sin_addr, buf,(socklen_t)len);
#endif
    }
    if (flags & 2) {
      snprintf(buf + strlen(buf), len - (strlen(buf) + 1), "%s%d",
               flags & 1 ? ":" : "", (int) ntohs(sa.sin.sin_port));
    }
  }
}